

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O2

EncodeNumberStatus
spvtools::utils::ParseAndEncodeFloatingPointNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  uint32_t uVar1;
  FloatProxy<double> FVar2;
  bool bVar3;
  EncodeNumberStatus EVar4;
  FloatProxy<float> __args;
  char *val;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  hVal;
  ErrorMsgStream local_30;
  
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_30,error_msg);
    (anonymous_namespace)::ErrorMsgStream::operator<<
              ((ErrorMsgStream *)&local_30,"The given text is a nullptr");
LAB_001969b7:
    anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_30);
    EVar4 = kInvalidText;
  }
  else {
    if (type->kind != SPV_NUMBER_FLOATING) {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_30,error_msg);
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)&local_30,"The expected type is not a float type");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_30);
      return kInvalidUsage;
    }
    uVar1 = type->bitwidth;
    if (uVar1 == 0x40) {
      _hVal = 0;
      bVar3 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>>
                        (text,(HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                               *)&hVal);
      FVar2.data_ = _hVal;
      if (!bVar3) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_30,error_msg);
        val = "Invalid 64-bit float literal: ";
        goto LAB_001969a1;
      }
      std::function<void_(unsigned_int)>::operator()(emit,(uint)_hVal);
      __args.data_ = (uint)(FVar2.data_ >> 0x20);
    }
    else if (uVar1 == 0x20) {
      _hVal = _hVal & 0xffffffff00000000;
      bVar3 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
                        (text,(HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                               *)&hVal);
      if (!bVar3) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_30,error_msg);
        val = "Invalid 32-bit float literal: ";
        goto LAB_001969a1;
      }
      __args = _hVal;
    }
    else {
      if (uVar1 != 0x10) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_30,error_msg);
        (anonymous_namespace)::ErrorMsgStream::operator<<
                  ((ErrorMsgStream *)&local_30,"Unsupported ");
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_30.stream_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::ostream::operator<<
                    ((void *)local_30.stream_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl,uVar1);
        }
        (anonymous_namespace)::ErrorMsgStream::operator<<
                  ((ErrorMsgStream *)&local_30,"-bit float literals");
        anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_30);
        return kUnsupported;
      }
      _hVal = _hVal & 0xffffffffffff0000;
      bVar3 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
                        (text,&hVal);
      if (!bVar3) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_30,error_msg);
        val = "Invalid 16-bit float literal: ";
LAB_001969a1:
        (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_30,val);
        (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_30,text);
        goto LAB_001969b7;
      }
      __args.data_ = (uint)(ushort)hVal.value_.data_;
    }
    std::function<void_(unsigned_int)>::operator()(emit,__args.data_);
    EVar4 = kSuccess;
  }
  return EVar4;
}

Assistant:

EncodeNumberStatus ParseAndEncodeFloatingPointNumber(
    const char* text, const NumberType& type,
    std::function<void(uint32_t)> emit, std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (!IsFloating(type)) {
    ErrorMsgStream(error_msg) << "The expected type is not a float type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  const auto bit_width = AssumedBitWidth(type);
  switch (bit_width) {
    case 16: {
      HexFloat<FloatProxy<Float16>> hVal(0);
      if (!ParseNumber(text, &hVal)) {
        ErrorMsgStream(error_msg) << "Invalid 16-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      // getAsFloat will return the Float16 value, and get_value
      // will return a uint16_t representing the bits of the float.
      // The encoding is therefore correct from the perspective of the SPIR-V
      // spec since the top 16 bits will be 0.
      emit(static_cast<uint32_t>(hVal.value().getAsFloat().get_value()));
      return EncodeNumberStatus::kSuccess;
    } break;
    case 32: {
      HexFloat<FloatProxy<float>> fVal(0.0f);
      if (!ParseNumber(text, &fVal)) {
        ErrorMsgStream(error_msg) << "Invalid 32-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      emit(BitwiseCast<uint32_t>(fVal));
      return EncodeNumberStatus::kSuccess;
    } break;
    case 64: {
      HexFloat<FloatProxy<double>> dVal(0.0);
      if (!ParseNumber(text, &dVal)) {
        ErrorMsgStream(error_msg) << "Invalid 64-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      uint64_t decoded_val = BitwiseCast<uint64_t>(dVal);
      uint32_t low = uint32_t(0x00000000ffffffff & decoded_val);
      uint32_t high = uint32_t((0xffffffff00000000 & decoded_val) >> 32);
      emit(low);
      emit(high);
      return EncodeNumberStatus::kSuccess;
    } break;
    default:
      break;
  }
  ErrorMsgStream(error_msg)
      << "Unsupported " << bit_width << "-bit float literals";
  return EncodeNumberStatus::kUnsupported;
}